

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmng(fitsfile *mfptr,long *ngroups,int *status)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *in_RDX;
  fitsfile *in_RSI;
  bool bVar4;
  char *unaff_retaddr;
  fitsfile *in_stack_00000008;
  char *tkeyvalue;
  char comment [73];
  char card [81];
  char newKeyword [75];
  char keyword [75];
  char *inclist [1];
  long grpid;
  int i;
  int newIndex;
  int index;
  int offset;
  char *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  void *local_1a0;
  int *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  long *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  fitsfile *in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffef0;
  fitsfile *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff10;
  char local_e8 [4];
  int in_stack_ffffffffffffff1c;
  char **in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  char **in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char **in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffffc8;
  int iVar5;
  uint uVar6;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_RDX == 0) {
    *(long *)in_RSI = 0;
    iVar1 = ffgrec((fitsfile *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                   in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,(int *)0x1d8ccc);
    *in_RDX = iVar1;
    while (*in_RDX == 0) {
      iVar1 = ffgnxk(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff50);
      *in_RDX = iVar1;
      if (*in_RDX == 0) {
        *(long *)in_RSI = *(long *)in_RSI + 1;
      }
    }
    if (*in_RDX == 0xca) {
      *in_RDX = 0;
    }
    uVar6 = 1;
    iVar1 = 0;
    iVar5 = 1;
    while( true ) {
      bVar4 = false;
      if ((long)iVar5 <= *(long *)in_RSI) {
        bVar4 = *in_RDX == 0;
      }
      if (!bVar4) break;
      snprintf(&stack0xffffffffffffff68,0x4b,"GRPID%d",(ulong)uVar6);
      iVar2 = ffgkyj(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      *in_RDX = iVar2;
      if (*in_RDX == 0xca) {
        *in_RDX = 0;
        iVar1 = iVar1 + 1;
      }
      else {
        iVar5 = iVar5 + 1;
        if (0 < iVar1) {
          uVar3 = uVar6 - iVar1;
          snprintf(local_e8,0x4b,"GRPID%d",(ulong)uVar3);
          ffmnam(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
          snprintf(&stack0xffffffffffffff68,0x4b,"GRPLC%d",(ulong)uVar6);
          snprintf(local_e8,0x4b,"GRPLC%d",(ulong)uVar3);
          iVar2 = ffgkls(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         &in_stack_ffffffffffffff58->HDUposition);
          *in_RDX = iVar2;
          if (*in_RDX == 0) {
            ffdkey(in_stack_00000008,unaff_retaddr,
                   (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
            ffikls(in_RSI,(char *)in_RDX,(char *)CONCAT44(iVar1,uVar6),(char *)CONCAT44(uVar3,iVar5)
                   ,in_stack_ffffffffffffffc8);
            ffplsw(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
            free(local_1a0);
          }
          if (*in_RDX == 0xca) {
            *in_RDX = 0;
          }
        }
      }
      uVar6 = uVar6 + 1;
    }
    iVar1 = *in_RDX;
  }
  else {
    iVar1 = *in_RDX;
  }
  return iVar1;
}

Assistant:

int ffgmng(fitsfile *mfptr,   /* FITS file pointer to member HDU            */
	   long     *ngroups, /* total number of groups linked to HDU       */
	   int      *status)  /* return status code                         */

/*
  return the number of groups to which a HDU belongs, as defined by the number
  of GRPIDn/GRPLCn keyword records that appear in the HDU header. The 
  fitsfile pointer mfptr must be positioned with the member HDU as the CHDU. 
  Each time this function is called, the indicies of the GRPIDn/GRPLCn
  keywords are checked to make sure they are continuous (ie no gaps) and
  are re-enumerated to eliminate gaps if gaps are found to be present.
*/

{
  int offset;
  int index;
  int newIndex;
  int i;
  
  long grpid;

  char *inclist[] = {"GRPID#"};
  char keyword[FLEN_KEYWORD];
  char newKeyword[FLEN_KEYWORD];
  char card[FLEN_CARD];
  char comment[FLEN_COMMENT];
  char *tkeyvalue;

  if(*status != 0) return(*status);

  *ngroups = 0;

  /* reset the member HDU keyword counter to the beginning */

  *status = ffgrec(mfptr,0,card,status);
  
  /*
    search for the number of GRPIDn keywords in the member HDU header
    and count them with the ngroups variable
  */
  
  while(*status == 0)
    {
      /* read the next GRPIDn keyword in the series */

      *status = fits_find_nextkey(mfptr,inclist,1,NULL,0,card,status);
      
      if(*status != 0) continue;
      
      ++(*ngroups);
    }

  if(*status == KEY_NO_EXIST) *status = 0;
      
  /*
     read each GRPIDn/GRPLCn keyword and adjust their index values so that
     there are no gaps in the index count
  */

  for(index = 1, offset = 0, i = 1; i <= *ngroups && *status == 0; ++index)
    {	  
      snprintf(keyword,FLEN_KEYWORD,"GRPID%d",index);

      /* try to read the next GRPIDn keyword in the series */

      *status = fits_read_key_lng(mfptr,keyword,&grpid,card,status);

      /* if not found then increment the offset counter and continue */

      if(*status == KEY_NO_EXIST) 
	{
	  *status = 0;
	  ++offset;
	}
      else
	{
	  /* 
	     increment the number_keys_found counter and see if the index
	     of the keyword needs to be updated
	  */

	  ++i;

	  if(offset > 0)
	    {
	      /* compute the new index for the GRPIDn/GRPLCn keywords */
	      newIndex = index - offset;

	      /* update the GRPIDn keyword index */

	      snprintf(newKeyword,FLEN_KEYWORD,"GRPID%d",newIndex);
	      fits_modify_name(mfptr,keyword,newKeyword,status);

	      /* If present, update the GRPLCn keyword index */

	      snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",index);
	      snprintf(newKeyword,FLEN_KEYWORD,"GRPLC%d",newIndex);
	      /* SPR 1738 */
	      *status = fits_read_key_longstr(mfptr,keyword,&tkeyvalue,comment,
					      status);
	      if (0 == *status) {
		fits_delete_key(mfptr,keyword,status);
		fits_insert_key_longstr(mfptr,newKeyword,tkeyvalue,comment,status);
		fits_write_key_longwarn(mfptr,status);
		free(tkeyvalue);
	      }
	      

	      if(*status == KEY_NO_EXIST) *status = 0;
	    }
	}
    }

  return(*status);
}